

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

uint32_t bcm2835_gpio_eds_multi(uint32_t mask)

{
  uint32_t uVar1;
  
  uVar1 = bcm2835_peri_read(bcm2835_gpio + 0x10);
  return uVar1 & mask;
}

Assistant:

uint32_t bcm2835_gpio_eds_multi(uint32_t mask)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPEDS0/4;
    uint32_t value = bcm2835_peri_read(paddr);
    return (value & mask);
}